

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int http_sse_write(http_sse_s *sse,http_sse_write_args args)

{
  int iVar1;
  FIOBJ dest;
  FIOBJ obj;
  FIOBJ i;
  size_t total;
  FIOBJ buf;
  http_sse_s *sse_local;
  
  if (sse != (http_sse_s *)0x0) {
    if ((args.id.len + args.data.len + args.event.len != 0) &&
       (iVar1 = fio_is_closed((intptr_t)sse[1].on_open), iVar1 == 0)) {
      dest = fiobj_str_buf(args.id.len + args.event.len + args.data.len + 0x2c);
      http_sse_copy2str(dest,"id: ",4,args.id);
      http_sse_copy2str(dest,"event: ",7,args.event);
      if (args.retry != 0) {
        obj = fiobj_num_new(args.retry);
        fiobj_str_write(dest,"retry: ",7);
        fiobj_str_concat(dest,obj);
        fiobj_free(obj);
      }
      http_sse_copy2str(dest,"data: ",6,args.data);
      fiobj_str_write(dest,"\r\n",2);
      iVar1 = (**(code **)(sse[1].on_ready + 0x58))(sse,dest);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int http_sse_write(http_sse_s *sse, struct http_sse_write_args args) {
  if (!sse || !(args.id.len + args.data.len + args.event.len) ||
      fio_is_closed(FIO_LS_EMBD_OBJ(http_sse_internal_s, sse, sse)->uuid))
    return -1;
  FIOBJ buf;
  {
    /* best guess at data length, ignoring missing fields and multiline data */
    const size_t total = 4 + args.id.len + 2 + 7 + args.event.len + 2 + 6 +
                         args.data.len + 2 + 7 + 10 + 4;
    buf = fiobj_str_buf(total);
  }
  http_sse_copy2str(buf, (char *)"id: ", 4, args.id);
  http_sse_copy2str(buf, (char *)"event: ", 7, args.event);
  if (args.retry) {
    FIOBJ i = fiobj_num_new(args.retry);
    fiobj_str_write(buf, (char *)"retry: ", 7);
    fiobj_str_join(buf, i);
    fiobj_free(i);
  }
  http_sse_copy2str(buf, (char *)"data: ", 6, args.data);
  fiobj_str_write(buf, "\r\n", 2);
  return FIO_LS_EMBD_OBJ(http_sse_internal_s, sse, sse)
      ->vtable->http_sse_write(sse, buf);
}